

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflectance.cpp
# Opt level: O1

Spectrum * __thiscall
phyr::BxDF::sample_f
          (Spectrum *__return_storage_ptr__,BxDF *this,Vector3f *wo,Vector3f *wi,Point2f *u,
          double *pdf,BxDFType *sampledType)

{
  double dVar1;
  Point2f PVar2;
  
  PVar2 = concentricSampleDisk(u);
  dVar1 = (1.0 - PVar2.x * PVar2.x) - PVar2.y * PVar2.y;
  if (dVar1 <= 0.0) {
    dVar1 = 0.0;
  }
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  wi->x = PVar2.x;
  wi->y = PVar2.y;
  wi->z = dVar1;
  if (wo->z <= 0.0 && wo->z != 0.0) {
    wi->z = -dVar1;
  }
  *pdf = (double)(-(ulong)(0.0 < wo->z * wi->z) & (ulong)(ABS(wi->z) * 0.3183098861837907));
  (*this->_vptr_BxDF[2])(__return_storage_ptr__,this,wo,wi);
  return __return_storage_ptr__;
}

Assistant:

Spectrum BxDF::sample_f(const Vector3f& wo, Vector3f* wi, const Point2f& u,
                        Real* pdf, BxDFType* sampledType) const {
    // Cosine-sample the hemisphere, flipping the direction if necessary
    *wi = cosineSampleHemisphere(u);
    if (wo.z < 0) wi->z *= -1;

    *pdf = BxDF::pdf(wo, *wi);
    return f(wo, *wi);
}